

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

void __thiscall cmCommandArgumentParserHelper::CleanupParser(cmCommandArgumentParserHelper *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  
  ppcVar2 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar3 != ppcVar2; ppcVar3 = ppcVar3 + 1) {
    if (*ppcVar3 != (char *)0x0) {
      operator_delete__(*ppcVar3);
    }
    ppcVar2 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppcVar3 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ppcVar3 != ppcVar2) &&
     (ppcVar1 = (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish,
     ppcVar3 = (pointer)((long)ppcVar3 + ((long)ppcVar1 - (long)ppcVar2)), ppcVar1 != ppcVar3)) {
    (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar3;
  }
  return;
}

Assistant:

void cmCommandArgumentParserHelper::CleanupParser()
{
  std::vector<char*>::iterator sit;
  for ( sit = this->Variables.begin();
    sit != this->Variables.end();
    ++ sit )
    {
    delete [] *sit;
    }
  this->Variables.erase(this->Variables.begin(), this->Variables.end());
}